

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O2

RealType __thiscall
OpenMD::GofROmega::evaluateAngle(GofROmega *this,StuntDouble *sd1,StuntDouble *sd2,StuntDouble *sd3)

{
  char cVar1;
  bool bVar2;
  ObjectType OVar3;
  double dVar4;
  Vector3d v2;
  Vector3d v1;
  MultipoleAdapter ma2;
  Vector<double,_3U> local_110;
  Vector<double,_3U> local_f8;
  Vector<double,_3U> local_e0;
  MultipoleAdapter local_c8;
  RectMatrix<double,_3U,_3U> local_c0;
  RotMat3x3d local_78;
  
  cVar1 = (((this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser.info_)->simParams_->
          UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  Vector<double,_3U>::Vector(&local_e0);
  Vector<double,_3U>::Vector(&local_f8);
  StuntDouble::getPos((Vector3d *)&local_78,sd3);
  StuntDouble::getPos((Vector3d *)&local_110,sd1);
  operator-((Vector<double,_3U> *)&local_c0,(Vector<double,_3U> *)&local_78,&local_110);
  Vector3<double>::operator=((Vector3<double> *)&local_e0,(Vector<double,_3U> *)&local_c0);
  if (cVar1 == '\x01') {
    Snapshot::wrapVector
              ((this->super_GofRAngle).super_RadialDistrFunc.currentSnapshot_,(Vector3d *)&local_e0)
    ;
  }
  OVar3 = sd2->objType_;
  if (1 < OVar3 - otDAtom) {
    (*sd2->_vptr_StuntDouble[7])((string *)&local_c0,sd2);
    snprintf(painCave.errMsg,2000,"GofROmega: attempted to use a non-directional object: %s\n",
             local_c0.data_[0][0]);
    std::__cxx11::string::~string((string *)&local_c0);
    painCave.isFatal = 1;
    simError();
    OVar3 = sd2->objType_;
  }
  if (OVar3 < otRigidBody) {
    local_c8.at_ = (AtomType *)sd2[1]._vptr_StuntDouble;
    bVar2 = MultipoleAdapter::isDipole(&local_c8);
    if (bVar2) {
      StuntDouble::getDipole((Vector3d *)&local_c0,sd2);
      Vector<double,_3U>::operator=(&local_f8,(Vector<double,_3U> *)&local_c0);
    }
    else {
      StuntDouble::getA(&local_78,sd2);
      SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_c0,&local_78);
      operator*(&local_110,&local_c0,(Vector<double,_3U> *)OpenMD::V3Z);
      Vector3<double>::operator=((Vector3<double> *)&local_f8,&local_110);
    }
  }
  else {
    StuntDouble::getA(&local_78,sd2);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_c0,&local_78);
    operator*(&local_110,&local_c0,(Vector<double,_3U> *)OpenMD::V3Z);
    Vector3<double>::operator=((Vector3<double> *)&local_f8,&local_110);
  }
  Vector<double,_3U>::normalize(&local_e0);
  Vector<double,_3U>::normalize(&local_f8);
  dVar4 = dot<double,3u>(&local_e0,&local_f8);
  return dVar4;
}

Assistant:

RealType GofROmega::evaluateAngle(StuntDouble* sd1, StuntDouble* sd2,
                                    StuntDouble* sd3) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d v1;
    Vector3d v2;

    v1 = sd3->getPos() - sd1->getPos();
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(v1);

    if (!sd2->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofROmega: attempted to use a non-directional object: %s\n",
               sd2->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (sd2->isAtom()) {
      AtomType* atype2     = static_cast<Atom*>(sd2)->getAtomType();
      MultipoleAdapter ma2 = MultipoleAdapter(atype2);

      if (ma2.isDipole())
        v2 = sd2->getDipole();
      else
        v2 = sd2->getA().transpose() * V3Z;
    } else {
      v2 = sd2->getA().transpose() * V3Z;
    }

    v1.normalize();
    v2.normalize();
    return dot(v1, v2);
  }